

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::BlockMultiNestedStructCase::init
          (BlockMultiNestedStructCase *this,EVP_PKEY_CTX *ctx)

{
  StructType *pSVar1;
  UniformBlock *pUVar2;
  BlockMultiNestedStructCase *extraout_RAX;
  VarType local_350;
  Uniform local_338;
  VarType local_2f8;
  Uniform local_2e0;
  VarType local_2a0;
  Uniform local_288;
  VarType local_248;
  Uniform local_230;
  UniformBlock *local_1f0;
  UniformBlock *blockB;
  Uniform local_1d0;
  VarType local_190;
  Uniform local_178;
  VarType local_138;
  Uniform local_120;
  UniformBlock *local_e0;
  UniformBlock *blockA;
  VarType local_c0;
  VarType local_a8;
  StructType *local_90;
  StructType *typeT;
  VarType local_70;
  VarType local_58;
  VarType local_30;
  StructType *local_18;
  StructType *typeS;
  BlockMultiNestedStructCase *this_local;
  
  typeS = (StructType *)this;
  pSVar1 = deqp::gls::ub::ShaderInterface::allocStruct
                     (&(this->super_UniformBlockCase).m_interface,"S");
  local_18 = pSVar1;
  deqp::gls::ub::VarType::VarType(&local_30,TYPE_FLOAT_MAT3,1);
  deqp::gls::ub::StructType::addMember(pSVar1,"a",&local_30,0);
  deqp::gls::ub::VarType::~VarType(&local_30);
  pSVar1 = local_18;
  deqp::gls::ub::VarType::VarType(&local_70,TYPE_INT_VEC2,2);
  deqp::gls::ub::VarType::VarType(&local_58,&local_70,4);
  deqp::gls::ub::StructType::addMember(pSVar1,"b",&local_58,0);
  deqp::gls::ub::VarType::~VarType(&local_58);
  deqp::gls::ub::VarType::~VarType(&local_70);
  pSVar1 = local_18;
  deqp::gls::ub::VarType::VarType((VarType *)&typeT,TYPE_FLOAT_VEC4,4);
  deqp::gls::ub::StructType::addMember(pSVar1,"c",(VarType *)&typeT,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&typeT);
  pSVar1 = deqp::gls::ub::ShaderInterface::allocStruct
                     (&(this->super_UniformBlockCase).m_interface,"T");
  local_90 = pSVar1;
  deqp::gls::ub::VarType::VarType(&local_a8,TYPE_UINT,2);
  deqp::gls::ub::StructType::addMember(pSVar1,"a",&local_a8,0xc00);
  deqp::gls::ub::VarType::~VarType(&local_a8);
  pSVar1 = local_90;
  deqp::gls::ub::VarType::VarType(&local_c0,local_18);
  deqp::gls::ub::StructType::addMember(pSVar1,"b",&local_c0,0);
  deqp::gls::ub::VarType::~VarType(&local_c0);
  pSVar1 = local_90;
  deqp::gls::ub::VarType::VarType((VarType *)&blockA,TYPE_BOOL_VEC4,0);
  deqp::gls::ub::StructType::addMember(pSVar1,"c",(VarType *)&blockA,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&blockA);
  pUVar2 = deqp::gls::ub::ShaderInterface::allocBlock
                     (&(this->super_UniformBlockCase).m_interface,"BlockA");
  local_e0 = pUVar2;
  deqp::gls::ub::VarType::VarType(&local_138,TYPE_FLOAT,4);
  deqp::gls::ub::Uniform::Uniform(&local_120,"a",&local_138,0);
  deqp::gls::ub::UniformBlock::addUniform(pUVar2,&local_120);
  deqp::gls::ub::Uniform::~Uniform(&local_120);
  deqp::gls::ub::VarType::~VarType(&local_138);
  pUVar2 = local_e0;
  deqp::gls::ub::VarType::VarType(&local_190,local_18);
  deqp::gls::ub::Uniform::Uniform(&local_178,"b",&local_190,0);
  deqp::gls::ub::UniformBlock::addUniform(pUVar2,&local_178);
  deqp::gls::ub::Uniform::~Uniform(&local_178);
  deqp::gls::ub::VarType::~VarType(&local_190);
  pUVar2 = local_e0;
  deqp::gls::ub::VarType::VarType((VarType *)&blockB,TYPE_UINT_VEC3,1);
  deqp::gls::ub::Uniform::Uniform(&local_1d0,"c",(VarType *)&blockB,0xc00);
  deqp::gls::ub::UniformBlock::addUniform(pUVar2,&local_1d0);
  deqp::gls::ub::Uniform::~Uniform(&local_1d0);
  deqp::gls::ub::VarType::~VarType((VarType *)&blockB);
  deqp::gls::ub::UniformBlock::setInstanceName(local_e0,"blockA");
  deqp::gls::ub::UniformBlock::setFlags(local_e0,this->m_flagsA);
  pUVar2 = deqp::gls::ub::ShaderInterface::allocBlock
                     (&(this->super_UniformBlockCase).m_interface,"BlockB");
  local_1f0 = pUVar2;
  deqp::gls::ub::VarType::VarType(&local_248,TYPE_FLOAT_MAT2,2);
  deqp::gls::ub::Uniform::Uniform(&local_230,"a",&local_248,0);
  deqp::gls::ub::UniformBlock::addUniform(pUVar2,&local_230);
  deqp::gls::ub::Uniform::~Uniform(&local_230);
  deqp::gls::ub::VarType::~VarType(&local_248);
  pUVar2 = local_1f0;
  deqp::gls::ub::VarType::VarType(&local_2a0,local_90);
  deqp::gls::ub::Uniform::Uniform(&local_288,"b",&local_2a0,0);
  deqp::gls::ub::UniformBlock::addUniform(pUVar2,&local_288);
  deqp::gls::ub::Uniform::~Uniform(&local_288);
  deqp::gls::ub::VarType::~VarType(&local_2a0);
  pUVar2 = local_1f0;
  deqp::gls::ub::VarType::VarType(&local_2f8,TYPE_BOOL_VEC4,0);
  deqp::gls::ub::Uniform::Uniform(&local_2e0,"c",&local_2f8,0xc00);
  deqp::gls::ub::UniformBlock::addUniform(pUVar2,&local_2e0);
  deqp::gls::ub::Uniform::~Uniform(&local_2e0);
  deqp::gls::ub::VarType::~VarType(&local_2f8);
  pUVar2 = local_1f0;
  deqp::gls::ub::VarType::VarType(&local_350,TYPE_BOOL,0);
  deqp::gls::ub::Uniform::Uniform(&local_338,"d",&local_350,0);
  deqp::gls::ub::UniformBlock::addUniform(pUVar2,&local_338);
  deqp::gls::ub::Uniform::~Uniform(&local_338);
  deqp::gls::ub::VarType::~VarType(&local_350);
  deqp::gls::ub::UniformBlock::setInstanceName(local_1f0,"blockB");
  deqp::gls::ub::UniformBlock::setFlags(local_1f0,this->m_flagsB);
  if (0 < this->m_numInstances) {
    deqp::gls::ub::UniformBlock::setArraySize(local_e0,this->m_numInstances);
    deqp::gls::ub::UniformBlock::setArraySize(local_1f0,this->m_numInstances);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_LOW));
		typeS.addMember("b", VarType(VarType(glu::TYPE_INT_VEC2, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH));

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_UINT, PRECISION_MEDIUM), UNUSED_BOTH);
		typeT.addMember("b", VarType(&typeS));
		typeT.addMember("c", VarType(glu::TYPE_BOOL_VEC4, 0));

		UniformBlock& blockA = m_interface.allocBlock("BlockA");
		blockA.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT, PRECISION_HIGH)));
		blockA.addUniform(Uniform("b", VarType(&typeS)));
		blockA.addUniform(Uniform("c", VarType(glu::TYPE_UINT_VEC3, PRECISION_LOW), UNUSED_BOTH));
		blockA.setInstanceName("blockA");
		blockA.setFlags(m_flagsA);

		UniformBlock& blockB = m_interface.allocBlock("BlockB");
		blockB.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT_MAT2, PRECISION_MEDIUM)));
		blockB.addUniform(Uniform("b", VarType(&typeT)));
		blockB.addUniform(Uniform("c", VarType(glu::TYPE_BOOL_VEC4, 0), UNUSED_BOTH));
		blockB.addUniform(Uniform("d", VarType(glu::TYPE_BOOL, 0)));
		blockB.setInstanceName("blockB");
		blockB.setFlags(m_flagsB);

		if (m_numInstances > 0)
		{
			blockA.setArraySize(m_numInstances);
			blockB.setArraySize(m_numInstances);
		}
	}